

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::RealMath1Function<&tanh>::eval
          (RealMath1Function<&tanh> *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  real_t in_RDI;
  real_t this_00;
  double __x;
  double result;
  ConstantValue v;
  ConstantValue *in_stack_ffffffffffffff58;
  EvalContext *this_01;
  real_t local_80;
  real_t local_78;
  double local_70;
  undefined4 local_68;
  
  this_01 = (EvalContext *)in_RDI.v;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)this_01,(EvalContext *)in_RDI.v);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xae763b);
  if (bVar1) {
    this_00 = slang::ConstantValue::real(in_stack_ffffffffffffff58);
    local_78 = this_00;
    __x = real_t::operator_cast_to_double(&local_78);
    local_70 = tanh(__x);
    real_t::real_t(&local_80,local_70);
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00.v,in_RDI);
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI.v,in_stack_ffffffffffffff58);
  }
  local_68 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xae76e6);
  return (ConstantValue *)this_01;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        ConstantValue v = args[0]->eval(context);
        if (!v)
            return nullptr;

        double result = Func(v.real());
        return real_t(result);
    }